

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * removeSuffix(string *path,string *extension)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong in_RSI;
  string *in_RDI;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator local_51;
  string local_50 [55];
  allocator local_19 [9];
  ulong local_10;
  
  local_10 = in_RSI;
  uVar3 = std::__cxx11::string::length();
  uVar4 = std::__cxx11::string::length();
  uVar1 = local_10;
  if (uVar3 < uVar4) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_50,uVar1);
    bVar2 = std::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    else {
      std::__cxx11::string::length();
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)in_RDI,local_10);
    }
    std::__cxx11::string::~string(local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  return in_RDI;
}

Assistant:

static std::string removeSuffix(const std::string& path,
                                const std::string& extension) {
  if (extension.length() >= path.length())
    return std::string("");
  std::string suffix = path.substr(path.length() - extension.length());
  if (suffix != extension)
    return std::string("");
  return path.substr(0, path.length() - extension.length());
}